

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void ODDLParser::OpenDDLParser::normalizeBuffer(vector<char,_std::allocator<char>_> *buffer)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  char *end_00;
  char *c;
  size_t readIdx;
  char *end;
  size_t len;
  vector<char,_std::allocator<char>_> newBuffer;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = buffer;
  bVar2 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (!bVar2) {
    std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&len);
    pcVar3 = (char *)std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)
                                newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                _16_8_);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                        (size_type)(pcVar3 + -1));
    end_00 = pvVar4 + 1;
    for (c = (char *)0x0; c < pcVar3; c = c + 1) {
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                          (size_type)c);
      bVar2 = isCommentOpenTag<char>(pvVar4,end_00);
      if (bVar2) {
        do {
          pcVar1 = c;
          c = pcVar1 + 1;
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)
                              newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              _16_8_,(size_type)c);
          bVar2 = isCommentCloseTag<char>(pvVar4,end_00);
        } while (((bVar2 ^ 0xffU) & 1) != 0);
        c = pcVar1 + 3;
      }
      else {
        bVar2 = isComment<char>(pvVar4,end_00);
        if ((bVar2) || (bVar2 = isNewLine<char>(*pvVar4), bVar2)) {
          bVar2 = isComment<char>(pvVar4,end_00);
          if (bVar2) {
            do {
              c = c + 1;
              pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)
                                  newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  _16_8_,(size_type)c);
              bVar2 = isEndofLine<char>(*pvVar4);
            } while (((bVar2 ^ 0xffU) & 1) != 0);
          }
        }
        else {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)
                              newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              _16_8_,(size_type)c);
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)&len,pvVar4);
        }
      }
    }
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)
               newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
               (vector<char,_std::allocator<char>_> *)&len);
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&len);
  }
  return;
}

Assistant:

void OpenDDLParser::normalizeBuffer( std::vector<char> &buffer) {
    if( buffer.empty() ) {
        return;
    }

    std::vector<char> newBuffer;
    const size_t len( buffer.size() );
    char *end( &buffer[ len-1 ] + 1 );
    for( size_t readIdx = 0; readIdx<len; ++readIdx ) {
        char *c( &buffer[readIdx] );
        // check for a comment
        if (isCommentOpenTag(c, end)) {
            ++readIdx;
            while (!isCommentCloseTag(&buffer[readIdx], end)) {
                ++readIdx;
            }
            ++readIdx;
            ++readIdx;
        } else if( !isComment<char>( c, end ) && !isNewLine( *c ) ) {
            newBuffer.push_back( buffer[ readIdx ] );
        } else {
            if( isComment<char>( c, end ) ) {
                ++readIdx;
                // skip the comment and the rest of the line
                while( !isEndofLine( buffer[ readIdx ] ) ) {
                    ++readIdx;
                }
            }
        }
    }
    buffer = newBuffer;
}